

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void __thiscall
gmlc::networking::TcpConnection::setDataCall
          (TcpConnection *this,
          function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
          *dataFunc)

{
  runtime_error *this_00;
  
  if ((this->state)._M_i == PRESTART) {
    std::
    function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
    ::operator=(&this->dataCall,dataFunc);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"cannot set data callback after socket is started");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t TcpConnection::send(const void* buffer, size_t dataLength)
{
    if (!isConnected()) {
        if (!waitUntilConnected(300ms)) {
            logger(0, "connection timeout waiting again");
        }
        if (!waitUntilConnected(200ms)) {
            logger(0, "connection timeout twice, now returning");
            return 0;
        }
    }

    size_t sz{0};
    size_t sent_size{dataLength};
    size_t p{0};
    int count{0};
    while (count++ < 5 &&
           (sz = socket_->write_some(
                reinterpret_cast<const char*>(buffer) + p, sent_size)) !=
               sent_size) {
        sent_size -= sz;
        p += sz;
        //   std::cerr << "DEBUG partial buffer sent" << std::endl;
    }
    if (count >= 5) {
        logger(0, "TcpConnection send terminated");
        return 0;
    }
    return dataLength;

    //  assert(sz == dataLength);
    //  return sz;
}